

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O0

vector<Interval,_std::allocator<Interval>_> *
expandLatest(vector<Interval,_std::allocator<Interval>_> *__return_storage_ptr__,Interval *latest,
            Rules *rules)

{
  bool bVar1;
  size_type sVar2;
  iterator __first;
  iterator __last;
  reference pIVar3;
  reference pvVar4;
  undefined1 local_1e8 [8];
  Interval interval;
  iterator __end4;
  iterator __begin4;
  vector<Interval,_std::allocator<Interval>_> *__range4;
  undefined1 local_100 [8];
  vector<Interval,_std::allocator<Interval>_> flattened;
  Range local_b8;
  undefined1 local_50 [8];
  vector<Range,_std::allocator<Range>_> exclusions;
  int local_24;
  int current_id;
  Rules *rules_local;
  Interval *latest_local;
  vector<Interval,_std::allocator<Interval>_> *intervals;
  
  local_24 = 0;
  std::vector<Interval,_std::allocator<Interval>_>::vector(__return_storage_ptr__);
  bVar1 = Range::is_open(&latest->super_Range);
  if (bVar1) {
    Datetime::Datetime((Datetime *)
                       &flattened.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    Range::Range(&local_b8,&(latest->super_Range).start,
                 (Datetime *)
                 &flattened.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    getAllExclusions((vector<Range,_std::allocator<Range>_> *)local_50,rules,&local_b8);
    Range::~Range(&local_b8);
    bVar1 = std::vector<Range,_std::allocator<Range>_>::empty
                      ((vector<Range,_std::allocator<Range>_> *)local_50);
    if (!bVar1) {
      flatten((vector<Interval,_std::allocator<Interval>_> *)local_100,latest,
              (vector<Range,_std::allocator<Range>_> *)local_50);
      sVar2 = std::vector<Interval,_std::allocator<Interval>_>::size
                        ((vector<Interval,_std::allocator<Interval>_> *)local_100);
      if (1 < sVar2) {
        __first = std::vector<Interval,_std::allocator<Interval>_>::begin
                            ((vector<Interval,_std::allocator<Interval>_> *)local_100);
        __last = std::vector<Interval,_std::allocator<Interval>_>::end
                           ((vector<Interval,_std::allocator<Interval>_> *)local_100);
        std::
        reverse<__gnu_cxx::__normal_iterator<Interval*,std::vector<Interval,std::allocator<Interval>>>>
                  ((__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                   )__first._M_current,
                   (__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                   )__last._M_current);
        __end4 = std::vector<Interval,_std::allocator<Interval>_>::begin
                           ((vector<Interval,_std::allocator<Interval>_> *)local_100);
        interval._tags._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)std::vector<Interval,_std::allocator<Interval>_>::end
                               ((vector<Interval,_std::allocator<Interval>_> *)local_100);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                                           *)&interval._tags._M_t._M_impl.super__Rb_tree_header.
                                              _M_node_count), bVar1) {
          pIVar3 = __gnu_cxx::
                   __normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                   ::operator*(&__end4);
          Interval::Interval((Interval *)local_1e8,pIVar3);
          interval.super_Range.end._date._4_1_ = 1;
          local_24 = local_24 + 1;
          interval.super_Range.end._date._0_4_ = local_24;
          std::vector<Interval,_std::allocator<Interval>_>::push_back
                    (__return_storage_ptr__,(value_type *)local_1e8);
          Interval::~Interval((Interval *)local_1e8);
          __gnu_cxx::
          __normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>::
          operator++(&__end4);
        }
      }
      std::vector<Interval,_std::allocator<Interval>_>::~vector
                ((vector<Interval,_std::allocator<Interval>_> *)local_100);
    }
    std::vector<Range,_std::allocator<Range>_>::~vector
              ((vector<Range,_std::allocator<Range>_> *)local_50);
  }
  bVar1 = std::vector<Interval,_std::allocator<Interval>_>::empty(__return_storage_ptr__);
  if (bVar1) {
    std::vector<Interval,_std::allocator<Interval>_>::push_back(__return_storage_ptr__,latest);
    pvVar4 = std::vector<Interval,_std::allocator<Interval>_>::back(__return_storage_ptr__);
    pvVar4->id = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector <Interval> expandLatest (const Interval& latest, const Rules& rules)
{
  int current_id = 0;
  std::vector <Interval> intervals;
  // If the latest interval is open, check for synthetic intervals
  if (latest.is_open ())
  {
    auto exclusions = getAllExclusions (rules, {latest.start, Datetime ()});
    if (! exclusions.empty ())
    {
      std::vector <Interval> flattened = flatten (latest, exclusions);

      // If flatten() converted the latest interval into a group of synthetic
      // intervals, the number of returned intervals will be greater than 1.
      // Otherwise, it just returned the non-synthetic, latest interval.
      if (flattened.size () > 1)
      {
        std::reverse (flattened.begin (), flattened.end ());
        for (auto interval : flattened)
        {
          interval.synthetic = true;
          interval.id = ++current_id;
          intervals.push_back (std::move (interval));
        }
      }
    }
  }

  if (intervals.empty ())
  {
    intervals.push_back (latest);
    intervals.back ().id = 1;
  }
  return intervals;
}